

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O1

Vec_Ptr_t * Gia_ManCollapse(Gia_Man_t *p,DdManager *dd,int nBddLimit,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  Vec_Ptr_t *vFuncs;
  void **__s;
  DdNode *pDVar3;
  ulong uVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  
  Gia_ManCreateRefs(p);
  iVar9 = p->nObjs;
  vFuncs = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar9 - 1U) {
    iVar6 = iVar9;
  }
  vFuncs->nSize = 0;
  vFuncs->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar6 << 3);
  }
  vFuncs->pArray = __s;
  vFuncs->nSize = iVar9;
  memset(__s,0,(long)iVar9 << 3);
  if (0 < *p->pRefs) {
    pDVar3 = Cudd_ReadLogicZero(dd);
    if (vFuncs->nSize < 1) {
LAB_0065d81d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    *vFuncs->pArray = pDVar3;
    pDVar3 = Cudd_ReadLogicZero(dd);
    Cudd_Ref(pDVar3);
  }
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar11 = 0;
    do {
      iVar9 = pVVar5->pArray[lVar11];
      lVar12 = (long)iVar9;
      if ((lVar12 < 0) || (p->nObjs <= iVar9)) goto LAB_0065d7df;
      if (iVar9 == 0) break;
      if (0 < p->pRefs[lVar12]) {
        pDVar3 = Cudd_bddIthVar(dd,(int)lVar11);
        if (vFuncs->nSize <= iVar9) goto LAB_0065d81d;
        vFuncs->pArray[lVar12] = pDVar3;
        pDVar3 = Cudd_bddIthVar(dd,(int)lVar11);
        Cudd_Ref(pDVar3);
      }
      lVar11 = lVar11 + 1;
      pVVar5 = p->vCis;
    } while (lVar11 < pVVar5->nSize);
  }
  if (0 < p->nObjs) {
    lVar12 = 0;
    lVar11 = 0;
    do {
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      uVar8 = *(ulong *)(&pGVar1->field_0x0 + lVar12);
      uVar2 = (uint)uVar8;
      if ((~uVar2 & 0x1fffffff) != 0 && -1 < (int)uVar2) {
        uVar4 = (ulong)-(uVar2 & 0x1fffffff) + lVar11;
        iVar9 = (int)uVar4;
        if ((iVar9 < 0) || (vFuncs->nSize <= iVar9)) goto LAB_0065d7fe;
        uVar2 = (uint)(uVar8 >> 0x20);
        uVar7 = (ulong)-(uVar2 & 0x1fffffff) + lVar11;
        iVar9 = (int)uVar7;
        if ((iVar9 < 0) || (vFuncs->nSize <= iVar9)) goto LAB_0065d7fe;
        pDVar3 = Cudd_bddAndLimit(dd,(DdNode *)
                                     ((ulong)((uint)(uVar8 >> 0x1d) & 1) ^
                                     (ulong)vFuncs->pArray[uVar4 & 0xffffffff]),
                                  (DdNode *)
                                  ((ulong)(uVar2 >> 0x1d & 1) ^
                                  (ulong)vFuncs->pArray[uVar7 & 0xffffffff]),nBddLimit);
        if (pDVar3 == (DdNode *)0x0) {
          Gia_ManCollapseDeref(dd,vFuncs);
          return (Vec_Ptr_t *)0x0;
        }
        Cudd_Ref(pDVar3);
        if (vFuncs->nSize <= lVar11) goto LAB_0065d81d;
        vFuncs->pArray[lVar11] = pDVar3;
        Gia_ObjCollapseDeref
                  (p,dd,vFuncs,(int)lVar11 - (*(uint *)(&pGVar1->field_0x0 + lVar12) & 0x1fffffff));
        Gia_ObjCollapseDeref
                  (p,dd,vFuncs,(int)lVar11 - (*(uint *)(&pGVar1->field_0x4 + lVar12) & 0x1fffffff));
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0xc;
    } while (lVar11 < p->nObjs);
  }
  pVVar5 = p->vCos;
  uVar2 = pVVar5->nSize;
  uVar8 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    lVar11 = 0;
    do {
      uVar2 = (uint)uVar8;
      iVar9 = pVVar5->pArray[lVar11];
      lVar12 = (long)iVar9;
      if ((lVar12 < 0) || (p->nObjs <= iVar9)) goto LAB_0065d7df;
      if (iVar9 == 0) break;
      pGVar1 = p->pObjs;
      uVar10 = (uint)*(undefined8 *)(pGVar1 + lVar12);
      uVar2 = iVar9 - (uVar10 & 0x1fffffff);
      if (((int)uVar2 < 0) || (vFuncs->nSize <= (int)uVar2)) goto LAB_0065d7fe;
      if (vFuncs->nSize <= iVar9) goto LAB_0065d81d;
      pDVar3 = (DdNode *)((ulong)(uVar10 >> 0x1d & 1) ^ (ulong)vFuncs->pArray[uVar2]);
      vFuncs->pArray[lVar12] = pDVar3;
      Cudd_Ref(pDVar3);
      Gia_ObjCollapseDeref(p,dd,vFuncs,iVar9 - (*(uint *)(pGVar1 + lVar12) & 0x1fffffff));
      lVar11 = lVar11 + 1;
      pVVar5 = p->vCos;
      uVar2 = pVVar5->nSize;
      uVar8 = (ulong)(int)uVar2;
    } while (lVar11 < (long)uVar8);
  }
  uVar10 = vFuncs->nSize;
  if ((long)(int)uVar10 < 1) {
    iVar9 = 0;
  }
  else {
    lVar11 = 0;
    iVar9 = 0;
    do {
      iVar9 = iVar9 + (uint)(vFuncs->pArray[lVar11] == (void *)0x0);
      lVar11 = lVar11 + 1;
    } while ((int)uVar10 != lVar11);
  }
  if (uVar10 != iVar9 + uVar2) {
    __assert_fail("Vec_PtrSize(vFuncs) == Vec_PtrCountZero(vFuncs) + Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaClp.c"
                  ,0x14c,"Vec_Ptr_t *Gia_ManCollapse(Gia_Man_t *, DdManager *, int, int)");
  }
  pVVar5 = p->vCos;
  uVar2 = pVVar5->nSize;
  uVar8 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    uVar4 = 0;
    uVar7 = 0;
    if (0 < (int)uVar10) {
      uVar7 = (ulong)uVar10;
    }
    do {
      uVar2 = (uint)uVar8;
      iVar9 = pVVar5->pArray[uVar4];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
LAB_0065d7df:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar9 == 0) break;
      if ((int)uVar10 <= iVar9) {
LAB_0065d7fe:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (uVar7 == uVar4) goto LAB_0065d81d;
      vFuncs->pArray[uVar4] = vFuncs->pArray[iVar9];
      uVar4 = uVar4 + 1;
      pVVar5 = p->vCos;
      uVar2 = pVVar5->nSize;
      uVar8 = (ulong)(int)uVar2;
    } while ((long)uVar4 < (long)uVar8);
  }
  if ((int)uVar2 <= (int)uVar10) {
    vFuncs->nSize = uVar2;
    return vFuncs;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Ptr_t * Gia_ManCollapse( Gia_Man_t * p, DdManager * dd, int nBddLimit, int fVerbose )
{
    Vec_Ptr_t * vFuncs;
    DdNode * bFunc0, * bFunc1, * bFunc;
    Gia_Obj_t * pObj;
    int i, Id;
    Gia_ManCreateRefs( p );
    // assign constant node
    vFuncs = Vec_PtrStart( Gia_ManObjNum(p) );
    if ( Gia_ObjRefNumId(p, 0) > 0 )
        Vec_PtrWriteEntry( vFuncs, 0, Cudd_ReadLogicZero(dd) ), Cudd_Ref(Cudd_ReadLogicZero(dd));
    // assign elementary variables
    Gia_ManForEachCiId( p, Id, i )
        if ( Gia_ObjRefNumId(p, Id) > 0 )
            Vec_PtrWriteEntry( vFuncs, Id, Cudd_bddIthVar(dd,i) ), Cudd_Ref(Cudd_bddIthVar(dd,i));
    // create BDD for AND nodes
    Gia_ManForEachAnd( p, pObj, i )
    {
        bFunc0 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId0(pObj, i)), Gia_ObjFaninC0(pObj) );
        bFunc1 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId1(pObj, i)), Gia_ObjFaninC1(pObj) );
        bFunc  = Cudd_bddAndLimit( dd, bFunc0, bFunc1, nBddLimit );  
        if ( bFunc == NULL )
        {
            Gia_ManCollapseDeref( dd, vFuncs );
            return NULL;
        }        
        Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vFuncs, i, bFunc );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId0(pObj, i) );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId1(pObj, i) );
    }
    // create BDD for outputs
    Gia_ManForEachCoId( p, Id, i )
    {
        pObj = Gia_ManCo( p, i );
        bFunc0 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId0(pObj, Id)), Gia_ObjFaninC0(pObj) );
        Vec_PtrWriteEntry( vFuncs, Id, bFunc0 ); Cudd_Ref( bFunc0 );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId0(pObj, Id) );
    }
    assert( Vec_PtrSize(vFuncs) == Vec_PtrCountZero(vFuncs) + Gia_ManCoNum(p) );
    // compact
    Gia_ManForEachCoId( p, Id, i )
        Vec_PtrWriteEntry( vFuncs, i, Vec_PtrEntry(vFuncs, Id) );
    Vec_PtrShrink( vFuncs, Gia_ManCoNum(p) );
    return vFuncs;
}